

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair(CrossingProcessor *this)

{
  vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
  *pvVar1;
  undefined8 __x;
  bool bVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  pointer ppVar7;
  iterator iVar8;
  iterator iVar9;
  CrossingInputEdge local_d0;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> local_cc [3];
  byte local_b1;
  S2LogMessage local_b0;
  S2LogMessageVoidify local_99;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *local_98;
  int local_90;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  local_88;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_const_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_const_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  local_78;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *local_68;
  int local_60;
  undefined1 local_58 [8];
  iterator it;
  pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_> *tmp;
  iterator __end1;
  iterator __begin1;
  SourceEdgeCrossings *__range1;
  SourceId local_20;
  SourceId local_18;
  CrossingProcessor *local_10;
  CrossingProcessor *this_local;
  
  local_10 = this;
  SourceId::SourceId(&local_18,-1);
  pmVar3 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&(this->source_id_map_).
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,&local_18);
  *pmVar3 = -1;
  SourceId::SourceId(&local_20,-2);
  pmVar3 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&(this->source_id_map_).
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,&local_20);
  *pmVar3 = -2;
  SourceId::SourceId((SourceId *)&__range1,-3);
  pmVar3 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&(this->source_id_map_).
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,(key_type *)&__range1);
  *pmVar3 = -3;
  pvVar1 = this->input_crossings_;
  sVar4 = std::
          vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
          ::size(this->input_crossings_);
  sVar5 = std::
          vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
          ::size(&this->source_edge_crossings_);
  std::
  vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
  ::reserve(pvVar1,sVar4 + sVar5);
  __end1 = std::
           vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
           ::begin(&this->source_edge_crossings_);
  tmp = (pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_> *)
        std::
        vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
        ::end(&this->source_edge_crossings_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_*,_std::vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>_>
                                *)&tmp);
    if (!bVar2) {
      std::
      vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
      ::clear(&this->source_edge_crossings_);
      gtl::internal_btree::
      btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      ::clear((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
               *)&this->source_id_map_);
      return;
    }
    it._8_8_ = __gnu_cxx::
               __normal_iterator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_*,_std::vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>_>
               ::operator*(&__end1);
    iVar8 = gtl::internal_btree::
            btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
            ::find<S2BooleanOperation::SourceId>
                      ((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        *)&this->source_id_map_,&(((reference)it._8_8_)->second).first);
    local_68 = iVar8.node;
    local_60 = iVar8.position;
    local_58 = (undefined1  [8])local_68;
    it.node._0_4_ = local_60;
    iVar9 = gtl::internal_btree::
            btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
            ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                   *)&this->source_id_map_);
    local_98 = iVar9.node;
    local_90 = iVar9.position;
    local_88.node = local_98;
    local_88.position = local_90;
    gtl::internal_btree::
    btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_const_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_const_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
    ::
    btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*,_0>
              (&local_78,&local_88);
    bVar2 = gtl::internal_btree::
            btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
            ::operator!=((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
                          *)local_58,&local_78);
    local_b1 = 0;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                 ,0x6ad,kFatal,(ostream *)&std::cerr);
      local_b1 = 1;
      poVar6 = S2LogMessage::stream(&local_b0);
      poVar6 = std::operator<<(poVar6,"Check failed: it != source_id_map_.end() ");
      S2LogMessageVoidify::operator&(&local_99,poVar6);
    }
    __x = it._8_8_;
    if ((local_b1 & 1) != 0) break;
    pvVar1 = this->input_crossings_;
    ppVar7 = gtl::internal_btree::
             btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
             ::operator->((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
                           *)local_58);
    anon_unknown.dwarf_9d1d6::CrossingInputEdge::CrossingInputEdge
              (&local_d0,ppVar7->second,(bool)(*(byte *)(it._8_8_ + 0xc) & 1));
    local_cc[0] = std::make_pair<int_const&,(anonymous_namespace)::CrossingInputEdge>
                            ((int *)__x,&local_d0);
    std::
    vector<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    ::push_back(pvVar1,local_cc);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_*,_std::vector<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>_>
    ::operator++(&__end1);
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b0);
}

Assistant:

void S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair() {
  // Add entries that translate the "special" crossings.
  source_id_map_[SourceId(kSetInside)] = kSetInside;
  source_id_map_[SourceId(kSetInvertB)] = kSetInvertB;
  source_id_map_[SourceId(kSetReverseA)] = kSetReverseA;
  input_crossings_->reserve(input_crossings_->size() +
                            source_edge_crossings_.size());
  for (const auto& tmp : source_edge_crossings_) {
    auto it = source_id_map_.find(tmp.second.first);
    S2_DCHECK(it != source_id_map_.end());
    input_crossings_->push_back(make_pair(
        tmp.first, CrossingInputEdge(it->second, tmp.second.second)));
  }
  source_edge_crossings_.clear();
  source_id_map_.clear();
}